

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_PlayerOnSpecial3DFloor(player_t *player)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  undefined8 *puVar6;
  APlayerPawn *ac;
  int floorType;
  long lVar7;
  double dVar8;
  double dVar9;
  
  peVar4 = ((player->mo->super_AActor).Sector)->e;
  ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
  uVar2 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  lVar7 = 0;
  do {
    if ((ulong)uVar2 << 3 == lVar7) {
      return;
    }
    puVar6 = *(undefined8 **)((long)ppFVar5 + lVar7);
    uVar3 = *(uint *)(puVar6 + 0xb);
    if ((uVar3 & 0x200001) == 1) {
      dVar1 = (player->mo->super_AActor).__Pos.Z;
      dVar8 = secplane_t::ZatPoint((secplane_t *)puVar6[5],&player->mo->super_AActor);
      if ((uVar3 & 2) == 0) {
        if (dVar1 <= dVar8) {
          ac = player->mo;
          dVar1 = (ac->super_AActor).__Pos.Z;
          dVar8 = (ac->super_AActor).Height;
          dVar9 = secplane_t::ZatPoint((secplane_t *)*puVar6,&ac->super_AActor);
          if (dVar9 <= dVar1 + dVar8) goto LAB_0047538d;
        }
      }
      else if ((dVar1 == dVar8) && (!NAN(dVar1) && !NAN(dVar8))) {
LAB_0047538d:
        P_PlayerInSpecialSector(player,(sector_t *)puVar6[0xd]);
        floorType = sector_t::GetTerrain((sector_t *)puVar6[0xd],*(int *)(puVar6 + 8));
        P_PlayerOnSpecialFlat(player,floorType);
        return;
      }
    }
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

void P_PlayerOnSpecial3DFloor(player_t* player)
{
	for(auto rover : player->mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;
		if (rover->flags & FF_FIX) continue;

		// Check the 3D floor's type...
		if(rover->flags & FF_SOLID)
		{
			// Player must be on top of the floor to be affected...
			if(player->mo->Z() != rover->top.plane->ZatPoint(player->mo)) continue;
		}
		else
		{
			//Water and DEATH FOG!!! heh
			if (player->mo->Z() > rover->top.plane->ZatPoint(player->mo) || 
				player->mo->Top() < rover->bottom.plane->ZatPoint(player->mo))
				continue;
		}

		// Apply sector specials
		P_PlayerInSpecialSector(player, rover->model);

		// Apply flat specials (using the ceiling!)
		P_PlayerOnSpecialFlat(
			player, rover->model->GetTerrain(rover->top.isceiling));

		break;
	}
}